

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
          (SourceLocationCommentPrinter *this,string *output)

{
  pointer pbVar1;
  pointer comment_text;
  string local_b0;
  undefined1 local_90 [48];
  AlphaNum local_60;
  
  if (this->have_source_loc_ == true) {
    comment_text = (this->source_loc_).leading_detached_comments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->source_loc_).leading_detached_comments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (comment_text != pbVar1) {
      do {
        FormatComment(&local_b0,this,comment_text);
        local_60.piece_._M_len = local_b0._M_string_length;
        local_60.piece_._M_str = local_b0._M_dataplus._M_p;
        local_90._0_8_ = (char *)0x1;
        local_90._8_8_ = "\n";
        absl::lts_20250127::StrAppend(output,&local_60,(AlphaNum *)local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        comment_text = comment_text + 1;
      } while (comment_text != pbVar1);
    }
    if ((this->source_loc_).leading_comments._M_string_length != 0) {
      FormatComment((string *)local_90,this,&(this->source_loc_).leading_comments);
      local_60.piece_._M_len = local_90._8_8_;
      local_60.piece_._M_str = (char *)local_90._0_8_;
      absl::lts_20250127::StrAppend(output,&local_60);
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
    }
  }
  return;
}

Assistant:

void AddPreComment(std::string* output) {
    if (have_source_loc_) {
      // Detached leading comments.
      for (const std::string& leading_detached_comment :
           source_loc_.leading_detached_comments) {
        absl::StrAppend(output, FormatComment(leading_detached_comment), "\n");
      }
      // Attached leading comments.
      if (!source_loc_.leading_comments.empty()) {
        absl::StrAppend(output, FormatComment(source_loc_.leading_comments));
      }
    }
  }